

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O2

void __thiscall S2Loop::Invert(S2Loop *this)

{
  VType *pVVar1;
  S2Point *pSVar2;
  uint uVar3;
  S2LogMessage local_48;
  VType VStack_38;
  VType local_30;
  VType VStack_28;
  
  if (this->owns_vertices_ != false) {
    ClearIndex(this);
    if ((long)this->num_vertices_ == 1) {
      local_48.severity_ = kInfo;
      local_48._4_4_ = 0;
      local_48.stream_ = (ostream *)0x0;
      if ((this->origin_inside_ & 1U) == 0) {
        uVar3 = 0xbff00000;
      }
      else {
        uVar3 = 0x3ff00000;
      }
      pSVar2 = this->vertices_;
      pSVar2->c_[0] = 0.0;
      pSVar2->c_[1] = 0.0;
      pSVar2->c_[2] = (VType)((ulong)uVar3 << 0x20);
    }
    else {
      std::__reverse<Vector3<double>*>(this->vertices_,this->vertices_ + this->num_vertices_);
    }
    this->origin_inside_ = (bool)(this->origin_inside_ ^ 1);
    if (((this->bound_).lat_.bounds_.c_[0] <= -1.5707963267948966) ||
       (pVVar1 = (this->bound_).lat_.bounds_.c_ + 1,
       1.5707963267948966 < *pVVar1 || *pVVar1 == 1.5707963267948966)) {
      InitBound(this);
    }
    else {
      S2LatLngRect::Full();
      (this->bound_).lng_.bounds_.c_[0] = local_30;
      (this->bound_).lng_.bounds_.c_[1] = VStack_28;
      (this->bound_).lat_.bounds_.c_[0] = (VType)local_48.stream_;
      (this->bound_).lat_.bounds_.c_[1] = VStack_38;
      (this->subregion_bound_).lng_.bounds_.c_[0] = local_30;
      (this->subregion_bound_).lng_.bounds_.c_[1] = VStack_28;
      (this->subregion_bound_).lat_.bounds_.c_[0] = (VType)local_48.stream_;
      (this->subregion_bound_).lat_.bounds_.c_[1] = VStack_38;
    }
    InitIndex(this);
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
             ,0x169,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_48.stream_,"Check failed: owns_vertices_ ");
  abort();
}

Assistant:

void S2Loop::Invert() {
  S2_CHECK(owns_vertices_);
  ClearIndex();
  if (is_empty_or_full()) {
    vertices_[0] = is_full() ? kEmptyVertex() : kFullVertex();
  } else {
    std::reverse(vertices_, vertices_ + num_vertices());
  }
  // origin_inside_ must be set correctly before building the S2ShapeIndex.
  origin_inside_ ^= true;
  if (bound_.lat().lo() > -M_PI_2 && bound_.lat().hi() < M_PI_2) {
    // The complement of this loop contains both poles.
    subregion_bound_ = bound_ = S2LatLngRect::Full();
  } else {
    InitBound();
  }
  InitIndex();
}